

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O0

void __thiscall UnitTest_table4::UnitTest_table4(UnitTest_table4 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_0026a6f8;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"table4");
  return;
}

Assistant:

TEST_CASE(table4)
{
    luna::Table t;
    luna::Value key;
    luna::Value value;

    value.type_ = luna::ValueT_Number;

    for (int i = 0; i < 3; ++i)
    {
        value.num_ = i + 1;
        t.InsertArrayValue(i + 1, value);
    }

    value.num_ = 0;
    t.InsertArrayValue(1, value);

    EXPECT_TRUE(t.ArraySize() == 4);

    key.type_ = luna::ValueT_Number;
    for (int i = 0; i < 4; ++i)
    {
        key.num_ = i + 1;
        value = t.GetValue(key);
        EXPECT_TRUE(value.type_ == luna::ValueT_Number);
        EXPECT_TRUE(value.num_ == i);
    }
}